

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

string * __thiscall
IDLExport::getIDLRelative
          (string *__return_storage_ptr__,IDLExport *this,Type *type,string *relative_to)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  first_finderF<const_char_*,_boost::algorithm::is_equal> Finder;
  iterator_range<const_char_*> FormatResult;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  long *plVar5;
  string *psVar6;
  size_type *psVar7;
  const_formatF<boost::iterator_range<const_char_*>_> Formatter;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FindResult;
  string ns;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  base;
  string local_e0;
  undefined1 local_c0 [32];
  char *local_a0;
  char *pcStack_98;
  char local_90 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  anon_unknown.dwarf_19656::getIDLBase(&local_80,type,this,&local_40);
  if (local_80.first._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_80.second._M_dataplus._M_p,
               local_80.second._M_dataplus._M_p + local_80.second._M_string_length);
  }
  else {
    Typelib::Type::getBasename_abi_cxx11_();
    plVar5 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_a0,0,(char *)0x0,
                                (ulong)local_80.first._M_dataplus._M_p);
    paVar2 = &local_e0.field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_e0.field_2._M_allocated_capacity = *psVar7;
      local_e0.field_2._8_8_ = plVar5[3];
      local_e0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar7;
      local_e0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_e0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Typelib::getMinimalPathTo((string *)local_c0,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if (local_a0 != local_90) {
      operator_delete(local_a0);
    }
    local_e0._M_dataplus._M_p = "/";
    local_e0._M_string_length = 0x11808b;
    _Var4._M_current = (char *)local_c0._0_8_;
    for (psVar6 = (string *)local_c0._8_8_; psVar6 != (string *)0x0;
        psVar6 = (string *)((long)&psVar6[-1].field_2 + 0xf)) {
      _Var1._M_current = _Var4._M_current + 1;
      if (*_Var4._M_current == '/') {
        if (_Var4._M_current != _Var1._M_current) {
          local_a0 = "::";
          pcStack_98 = "";
          Finder.m_Search.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_End = "";
          Finder.m_Search.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_Begin = "/";
          Finder._16_8_ = local_e0.field_2._M_allocated_capacity;
          FormatResult.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_End = "";
          FormatResult.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_Begin = "::";
          Formatter.m_Format.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_End = "";
          Formatter.m_Format.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_Begin = "::";
          FindResult.
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
          .
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
          .
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
          .m_End._M_current = _Var1._M_current;
          FindResult.
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
          .
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
          .
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin._M_current = _Var4._M_current;
          boost::algorithm::detail::
          find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::const_formatF<boost::iterator_range<char_const*>>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::iterator_range<char_const*>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                     Finder,Formatter,FindResult,FormatResult);
        }
        break;
      }
      _Var4._M_current = _Var1._M_current;
    }
    anon_unknown.dwarf_19656::normalizeIDLName
              (&local_e0,(anon_unknown_dwarf_19656 *)local_c0._0_8_,(string *)local_c0._8_8_);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_e0,(ulong)local_80.second._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      lVar3 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_unknown_dwarf_19656 *)local_c0._0_8_ != (anon_unknown_dwarf_19656 *)(local_c0 + 0x10))
    {
      operator_delete((void *)local_c0._0_8_);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.second._M_dataplus._M_p != &local_80.second.field_2) {
    operator_delete(local_80.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
    operator_delete(local_80.first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string IDLExport::getIDLRelative(Type const& type, std::string const& relative_to) const
{
    return ::getIDLRelative(type, relative_to, *this);
}